

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpege_api_v2.c
# Opt level: O0

MPP_RET jpege_proc_hal(void *ctx,HalEncTask *task)

{
  uint uVar1;
  MppFrame s;
  long lVar2;
  RK_U32 RVar3;
  RockchipSocType RVar4;
  JpegeSyntax *syntax_00;
  bool local_61;
  uint local_5c;
  RK_U32 part_mbs;
  RK_U32 part_rows;
  RK_U32 mb_h;
  RK_U32 mb_w;
  MppEncSliceSplit *split;
  MppEncCodecCfg *codec;
  MppEncPrepCfg *prep;
  MppEncCfgSet *cfg;
  JpegeSyntax *syntax;
  MppFrame frame;
  JpegeCtx *p;
  HalEncTask *task_local;
  void *ctx_local;
  
  s = task->frame;
  syntax_00 = (JpegeSyntax *)((long)ctx + 8);
  lVar2 = *ctx;
  if ((jpege_debug & 1) != 0) {
    _mpp_log_l(4,"jpege_api_v2","enter ctx %p\n","jpege_proc_hal",ctx);
  }
  syntax_00->width = *(RK_U32 *)(lVar2 + 0xc);
  *(undefined4 *)((long)ctx + 0xc) = *(undefined4 *)(lVar2 + 0x10);
  *(undefined4 *)((long)ctx + 0x10) = *(undefined4 *)(lVar2 + 0x14);
  *(undefined4 *)((long)ctx + 0x14) = *(undefined4 *)(lVar2 + 0x18);
  *(undefined4 *)((long)ctx + 0x2c) = *(undefined4 *)(lVar2 + 0x24);
  *(undefined4 *)((long)ctx + 0x30) = *(undefined4 *)(lVar2 + 0x38);
  *(undefined4 *)((long)ctx + 0x34) = *(undefined4 *)(lVar2 + 0x28);
  *(undefined4 *)((long)ctx + 0x38) = *(undefined4 *)(lVar2 + 0x50);
  *(undefined4 *)((long)ctx + 0x3c) = *(undefined4 *)(lVar2 + 0x58);
  RVar3 = mpp_frame_get_offset_x(s);
  *(RK_U32 *)((long)ctx + 0x40) = RVar3;
  RVar3 = mpp_frame_get_offset_y(s);
  *(RK_U32 *)((long)ctx + 0x44) = RVar3;
  *(undefined4 *)((long)ctx + 0x48) = *(undefined4 *)(lVar2 + 0x34c);
  *(undefined4 *)((long)ctx + 0x4c) = *(undefined4 *)(lVar2 + 0x350);
  *(undefined4 *)((long)ctx + 0x50) = *(undefined4 *)(lVar2 + 0x358);
  *(undefined4 *)((long)ctx + 0x54) = *(undefined4 *)(lVar2 + 0x354);
  *(undefined8 *)((long)ctx + 0x58) = *(undefined8 *)(lVar2 + 0x360);
  *(undefined8 *)((long)ctx + 0x60) = *(undefined8 *)(lVar2 + 0x368);
  *(undefined4 *)((long)ctx + 0xa4) = 0;
  *(undefined4 *)((long)ctx + 0xa8) = 0;
  *(undefined4 *)((long)ctx + 0xa0) = 0;
  init_jpeg_component_info(syntax_00);
  if (*(int *)(lVar2 + 0xe94) != 0) {
    local_5c = 0;
    if (*(int *)(lVar2 + 0xe94) == 2) {
      uVar1 = *(uint *)(lVar2 + 0xe98);
      if ((uVar1 == 0) || (*(uint *)((long)ctx + 0x20) < uVar1)) {
        _mpp_log_l(2,"jpege_api_v2","warning: invalid split arg %d > max %d\n","jpege_proc_hal",
                   (ulong)uVar1,(ulong)*(uint *)((long)ctx + 0x20));
      }
      else {
        local_5c = ((uVar1 + *(uint *)((long)ctx + 0x18)) - 1) / *(uint *)((long)ctx + 0x18);
        if (*(uint *)((long)ctx + 0x1c) <= local_5c) {
          local_5c = 0;
        }
      }
    }
    else {
      _mpp_log_l(2,"jpege_api_v2","warning: only mcu split is supported\n","jpege_proc_hal");
    }
    if (local_5c != 0) {
      *(uint *)((long)ctx + 0xa4) = local_5c;
      RVar4 = mpp_get_soc_type();
      if ((RVar4 == ROCKCHIP_SOC_RK3576) &&
         (*(uint *)(lVar2 + 0xe98) <= *(uint *)((long)ctx + 0x20))) {
        *(undefined4 *)((long)ctx + 0xa8) = *(undefined4 *)(lVar2 + 0xe98);
      }
      else {
        *(uint *)((long)ctx + 0xa8) = *(int *)((long)ctx + 0x18) * local_5c;
      }
      local_61 = *(int *)(lVar2 + 4) != 0 && local_5c != 0;
      *(uint *)((long)ctx + 0xa0) = (uint)local_61;
      if ((jpege_debug & 1) != 0) {
        _mpp_log_l(4,"jpege_api_v2","Split by CTU, part_rows %d, restart_ri %d","jpege_proc_hal",
                   (ulong)*(uint *)((long)ctx + 0xa4),(ulong)*(uint *)((long)ctx + 0xa8));
      }
    }
  }
  task->valid = 1;
  (task->syntax).data = syntax_00;
  (task->syntax).number = 1;
  if ((jpege_debug & 1) != 0) {
    _mpp_log_l(4,"jpege_api_v2","leave ctx %p\n","jpege_proc_hal",ctx);
  }
  return MPP_OK;
}

Assistant:

static MPP_RET jpege_proc_hal(void *ctx, HalEncTask *task)
{
    JpegeCtx *p = (JpegeCtx *)ctx;
    MppFrame frame = task->frame;
    JpegeSyntax *syntax = &p->syntax;
    MppEncCfgSet *cfg = p->cfg;
    MppEncPrepCfg *prep = &cfg->prep;
    MppEncCodecCfg *codec = &cfg->codec;
    MppEncSliceSplit *split = &cfg->split;

    jpege_dbg_func("enter ctx %p\n", ctx);

    syntax->width       = prep->width;
    syntax->height      = prep->height;
    syntax->hor_stride  = prep->hor_stride;
    syntax->ver_stride  = prep->ver_stride;
    syntax->format      = prep->format;
    syntax->format_out  = prep->format_out;
    syntax->color       = prep->color;
    syntax->rotation    = prep->rotation;
    syntax->mirroring   = prep->mirroring;
    syntax->offset_x    = mpp_frame_get_offset_x(frame);
    syntax->offset_y    = mpp_frame_get_offset_y(frame);
    syntax->quality     = codec->jpeg.quant;
    syntax->q_factor    = codec->jpeg.q_factor;
    syntax->qf_min      = codec->jpeg.qf_min;
    syntax->qf_max      = codec->jpeg.qf_max;
    syntax->qtable_y    = codec->jpeg.qtable_y;
    syntax->qtable_c    = codec->jpeg.qtable_u;
    syntax->part_rows   = 0;
    syntax->restart_ri  = 0;
    syntax->low_delay   = 0;

    init_jpeg_component_info(syntax);

    if (split->split_mode) {
        RK_U32 mb_w = syntax->mcu_hor_cnt;
        RK_U32 mb_h = syntax->mcu_ver_cnt;
        RK_U32 part_rows = 0;

        if (split->split_mode == MPP_ENC_SPLIT_BY_CTU) {
            RK_U32 part_mbs = split->split_arg;

            if (part_mbs > 0 && part_mbs <= syntax->mcu_cnt) {
                part_rows = (part_mbs + mb_w - 1) / mb_w;
                if (part_rows >= mb_h)
                    part_rows = 0;
            } else {
                mpp_err_f("warning: invalid split arg %d > max %d\n",
                          part_mbs, syntax->mcu_cnt);
            }
        } else {
            mpp_err_f("warning: only mcu split is supported\n");
        }

        if (part_rows) {
            syntax->part_rows   = part_rows;
            if (mpp_get_soc_type() == ROCKCHIP_SOC_RK3576 && split->split_arg <= syntax->mcu_cnt)
                syntax->restart_ri = split->split_arg;
            else
                syntax->restart_ri  = syntax->mcu_hor_cnt * part_rows;
            syntax->low_delay   = cfg->base.low_delay && part_rows;
            jpege_dbg_func("Split by CTU, part_rows %d, restart_ri %d",
                           syntax->part_rows, syntax->restart_ri);
        }
    }

    task->valid = 1;
    task->syntax.data = syntax;
    task->syntax.number = 1;

    jpege_dbg_func("leave ctx %p\n", ctx);
    return MPP_OK;
}